

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::ExternModuleDeclSyntax::ExternModuleDeclSyntax
          (ExternModuleDeclSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token externKeyword,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *actualAttributes,
          ModuleHeaderSyntax *header)

{
  size_t sVar1;
  pointer ppAVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar5 = externKeyword._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = ExternModuleDecl;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c7548;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c7a10;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar6 = 0;
    do {
      *(ExternModuleDeclSyntax **)(*(long *)((long)ppAVar2 + lVar6) + 8) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  (this->externKeyword).kind = (short)uVar5;
  (this->externKeyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->externKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->externKeyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->externKeyword).info = externKeyword.info;
  uVar4 = *(undefined4 *)&(actualAttributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (actualAttributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.kind =
       (actualAttributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (actualAttributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->actualAttributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c7548;
  (this->actualAttributes).super_SyntaxListBase.childCount =
       (actualAttributes->super_SyntaxListBase).childCount;
  sVar1 = (actualAttributes->
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->actualAttributes).
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (actualAttributes->
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->actualAttributes).
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->actualAttributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c7a10;
  (this->header).ptr = header;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->actualAttributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->actualAttributes).
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar6 = 0;
    do {
      *(ExternModuleDeclSyntax **)(*(long *)((long)ppAVar2 + lVar6) + 8) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  (header->super_SyntaxNode).parent = (SyntaxNode *)this;
  return;
}

Assistant:

struct SLANG_EXPORT ArgumentSyntax : public SyntaxNode {

    ArgumentSyntax(SyntaxKind kind) :
        SyntaxNode(kind) {
    }

    explicit ArgumentSyntax(const ArgumentSyntax&) = default;

    static bool isKind(SyntaxKind kind);
}